

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O2

void __thiscall ScriptHash_GetHex_Test::TestBody(ScriptHash_GetHex_Test *this)

{
  char *message;
  AssertHelper local_80;
  AssertionResult gtest_ar;
  string local_68;
  ScriptHash script_hash;
  string hex;
  
  std::__cxx11::string::string((string *)&hex,"1234",(allocator *)&script_hash);
  cfd::core::ScriptHash::ScriptHash(&script_hash,&hex);
  cfd::core::ScriptHash::GetHex_abi_cxx11_(&local_68,&script_hash);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"script_hash.GetHex().c_str()","\"1234\"",
             local_68._M_dataplus._M_p,"1234");
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scripthash.cpp"
               ,0x3c,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptHash::~ScriptHash(&script_hash);
  std::__cxx11::string::~string((string *)&hex);
  return;
}

Assistant:

TEST(ScriptHash, GetHex) {
  std::string hex("1234");
  ScriptHash script_hash(hex);
  EXPECT_STREQ(script_hash.GetHex().c_str(), "1234");
}